

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uregex.cpp
# Opt level: O2

int32_t icu_63::RegexCImpl::split
                  (RegularExpression *regexp,UChar *destBuf,int32_t destCapacity,
                  int32_t *requiredCapacity,UChar **destFields,int32_t destFieldsCapacity,
                  UErrorCode *status)

{
  UChar *dest;
  RegexMatcher *this;
  int32_t destCapacity_00;
  UBool UVar1;
  int32_t iVar2;
  int32_t iVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  int32_t *piVar11;
  long lVar12;
  UChar **ppUVar13;
  UErrorCode local_90;
  int32_t local_8c;
  long local_88;
  int local_7c;
  ulong local_78;
  int32_t *local_70;
  long local_68;
  UChar *local_60;
  long local_58;
  UText *local_50;
  ulong local_48;
  UChar **local_40;
  UChar **local_38;
  
  local_8c = destCapacity;
  local_60 = destBuf;
  RegexMatcher::reset(regexp->fMatcher);
  this = regexp->fMatcher;
  local_68 = this->fInputLength;
  if (local_68 == 0) {
    iVar2 = 0;
  }
  else {
    local_50 = this->fInputText;
    local_70 = requiredCapacity;
    iVar2 = RegexMatcher::groupCount(this);
    local_90 = U_ZERO_ERROR;
    local_7c = destFieldsCapacity + -1;
    local_58 = (long)local_7c;
    local_38 = destFields + 1;
    iVar6 = 0;
    local_88 = 0;
    uVar9 = 0;
    local_78 = (ulong)(uint)destFieldsCapacity;
    local_40 = destFields;
    while (ppUVar13 = local_40, piVar11 = local_70, iVar5 = local_7c, iVar7 = (int)uVar9,
          iVar7 < local_7c) {
      UVar1 = RegexMatcher::find(regexp->fMatcher);
      dest = local_60 + iVar6;
      lVar10 = (long)iVar7;
      ppUVar13[lVar10] = dest;
      local_48 = uVar9;
      if (UVar1 == '\0') {
        iVar2 = 0;
        if (0 < local_8c - iVar6) {
          iVar2 = local_8c - iVar6;
        }
        iVar2 = utext_extract_63(local_50,local_88,local_68,dest,iVar2,status);
        iVar6 = iVar6 + iVar2 + 1;
        iVar8 = (int)local_78;
        piVar11 = local_70;
        iVar7 = (int)local_48;
        goto LAB_0015fd3d;
      }
      iVar3 = local_8c - iVar6;
      if (local_8c - iVar6 < 1) {
        iVar3 = 0;
      }
      iVar3 = utext_extract_63(local_50,local_88,regexp->fMatcher->fMatchStart,dest,iVar3,&local_90)
      ;
      ppUVar13 = local_38;
      if (local_90 == U_BUFFER_OVERFLOW_ERROR) {
        local_90 = U_ZERO_ERROR;
      }
      else {
        *status = local_90;
      }
      iVar5 = iVar6 + iVar3;
      local_88 = regexp->fMatcher->fMatchEnd;
      lVar12 = local_58 - lVar10;
      lVar4 = 0;
      while( true ) {
        iVar6 = iVar5 + 1;
        if (lVar12 == lVar4) break;
        iVar3 = (int32_t)(lVar4 + 1);
        if (iVar2 < iVar3) break;
        ppUVar13[lVar10 + lVar4] = local_60 + iVar6;
        local_90 = U_ZERO_ERROR;
        destCapacity_00 = local_8c - iVar6;
        if (local_8c - iVar6 < 1) {
          destCapacity_00 = 0;
        }
        iVar3 = uregex_group_63((URegularExpression *)regexp,iVar3,local_60 + iVar6,destCapacity_00,
                                &local_90);
        if (local_90 == U_BUFFER_OVERFLOW_ERROR) {
          local_90 = U_ZERO_ERROR;
        }
        else {
          *status = local_90;
        }
        iVar5 = iVar6 + iVar3;
        lVar4 = lVar4 + 1;
      }
      iVar7 = (int)lVar4;
      iVar8 = (int)local_48;
      if (local_88 == local_68) {
        if (iVar6 < local_8c) {
          local_60[iVar6] = L'\0';
          iVar7 = iVar8 + iVar7 + (uint)(iVar8 + iVar7 < local_7c);
          local_40[iVar7] = local_60 + iVar6;
        }
        else {
          iVar7 = iVar8 + iVar7 + (uint)(iVar8 + iVar7 < local_7c);
        }
        iVar8 = (int)local_78;
        iVar6 = iVar5 + 2;
        piVar11 = local_70;
        ppUVar13 = local_40;
        goto LAB_0015fd3d;
      }
      uVar9 = (ulong)(iVar8 + iVar7 + 1);
    }
    iVar8 = (int)local_78;
    if (local_88 < local_68) {
      if (iVar7 != local_7c) {
        iVar6 = (int)((ulong)((long)local_40[local_58] - (long)*local_40) >> 1);
      }
      local_40[local_58] = local_60 + iVar6;
      iVar2 = 0;
      if (0 < local_8c - iVar6) {
        iVar2 = local_8c - iVar6;
      }
      iVar2 = utext_extract_63(local_50,local_88,local_68,local_60 + iVar6,iVar2,status);
      iVar6 = iVar6 + iVar2 + 1;
      iVar7 = iVar5;
    }
LAB_0015fd3d:
    iVar2 = iVar7 + 1;
    for (lVar10 = (long)iVar2; lVar10 < iVar8; lVar10 = lVar10 + 1) {
      ppUVar13[lVar10] = (UChar *)0x0;
    }
    if (piVar11 != (int32_t *)0x0) {
      *piVar11 = iVar6;
    }
    if (local_8c < iVar6) {
      *status = U_BUFFER_OVERFLOW_ERROR;
    }
  }
  return iVar2;
}

Assistant:

int32_t RegexCImpl::split(RegularExpression     *regexp,
                          UChar                 *destBuf,
                          int32_t                destCapacity,
                          int32_t               *requiredCapacity,
                          UChar                 *destFields[],
                          int32_t                destFieldsCapacity,
                          UErrorCode            *status) {
    //
    // Reset for the input text
    //
    regexp->fMatcher->reset();
    UText *inputText = regexp->fMatcher->fInputText;
    int64_t   nextOutputStringStart = 0;
    int64_t   inputLen = regexp->fMatcher->fInputLength;
    if (inputLen == 0) {
        return 0;
    }

    //
    // Loop through the input text, searching for the delimiter pattern
    //
    int32_t   i;             // Index of the field being processed.
    int32_t   destIdx = 0;   // Next available position in destBuf;
    int32_t   numCaptureGroups = regexp->fMatcher->groupCount();
    UErrorCode  tStatus = U_ZERO_ERROR;   // Want to ignore any buffer overflow errors so that the strings are still counted
    for (i=0; ; i++) {
        if (i>=destFieldsCapacity-1) {
            // There are one or zero output strings left.
            // Fill the last output string with whatever is left from the input, then exit the loop.
            //  ( i will be == destFieldsCapacity if we filled the output array while processing
            //    capture groups of the delimiter expression, in which case we will discard the
            //    last capture group saved in favor of the unprocessed remainder of the
            //    input string.)
            if (inputLen > nextOutputStringStart) {
                if (i != destFieldsCapacity-1) {
                    // No fields are left.  Recycle the last one for holding the trailing part of
                    //   the input string.
                    i = destFieldsCapacity-1;
                    destIdx = (int32_t)(destFields[i] - destFields[0]);
                }

                destFields[i] = &destBuf[destIdx];
                destIdx += 1 + utext_extract(inputText, nextOutputStringStart, inputLen,
                                             &destBuf[destIdx], REMAINING_CAPACITY(destIdx, destCapacity), status);
            }
            break;
        }

        if (regexp->fMatcher->find()) {
            // We found another delimiter.  Move everything from where we started looking
            //  up until the start of the delimiter into the next output string.
            destFields[i] = &destBuf[destIdx];

            destIdx += 1 + utext_extract(inputText, nextOutputStringStart, regexp->fMatcher->fMatchStart,
                                         &destBuf[destIdx], REMAINING_CAPACITY(destIdx, destCapacity), &tStatus);
            if (tStatus == U_BUFFER_OVERFLOW_ERROR) {
                tStatus = U_ZERO_ERROR;
            } else {
                *status = tStatus;
            }
            nextOutputStringStart = regexp->fMatcher->fMatchEnd;

            // If the delimiter pattern has capturing parentheses, the captured
            //  text goes out into the next n destination strings.
            int32_t groupNum;
            for (groupNum=1; groupNum<=numCaptureGroups; groupNum++) {
                // If we've run out of output string slots, bail out.
                if (i==destFieldsCapacity-1) {
                    break;
                }
                i++;

                // Set up to extract the capture group contents into the dest buffer.
                destFields[i] = &destBuf[destIdx];
                tStatus = U_ZERO_ERROR;
                int32_t t = uregex_group((URegularExpression*)regexp,
                                         groupNum,
                                         destFields[i],
                                         REMAINING_CAPACITY(destIdx, destCapacity),
                                         &tStatus);
                destIdx += t + 1;    // Record the space used in the output string buffer.
                                     //  +1 for the NUL that terminates the string.
                if (tStatus == U_BUFFER_OVERFLOW_ERROR) {
                    tStatus = U_ZERO_ERROR;
                } else {
                    *status = tStatus;
                }
            }

            if (nextOutputStringStart == inputLen) {
                // The delimiter was at the end of the string.
                // Output an empty string, and then we are done.
                if (destIdx < destCapacity) {
                    destBuf[destIdx] = 0;
                }
                if (i < destFieldsCapacity-1) {
                   ++i;
                }
                if (destIdx < destCapacity) {
                    destFields[i] = destBuf + destIdx;
                }
                ++destIdx;
                break;
            }

        }
        else
        {
            // We ran off the end of the input while looking for the next delimiter.
            // All the remaining text goes into the current output string.
            destFields[i] = &destBuf[destIdx];
            destIdx += 1 + utext_extract(inputText, nextOutputStringStart, inputLen,
                                         &destBuf[destIdx], REMAINING_CAPACITY(destIdx, destCapacity), status);
            break;
        }
    }

    // Zero out any unused portion of the destFields array
    int j;
    for (j=i+1; j<destFieldsCapacity; j++) {
        destFields[j] = NULL;
    }

    if (requiredCapacity != NULL) {
        *requiredCapacity = destIdx;
    }
    if (destIdx > destCapacity) {
        *status = U_BUFFER_OVERFLOW_ERROR;
    }
    return i+1;
}